

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Query.cpp
# Opt level: O2

QueryResult * __thiscall
Query::run(QueryResult *__return_storage_ptr__,Query *this,QueryPrimitive *primitive,
          PrefetchFunc *prefetcher,QueryCounters *counters)

{
  uint32_t uVar1;
  QueryType QVar2;
  Query *pQVar3;
  pointer pQVar4;
  bool bVar5;
  bool bVar6;
  runtime_error *this_00;
  uint32_t cutoff;
  Query *query;
  Query *this_01;
  pointer this_02;
  ulong uVar7;
  long lVar8;
  ulong local_c8;
  vector<QueryResult_*,_std::allocator<QueryResult_*>_> results_ptrs;
  pointer local_88;
  QueryResult next;
  vector<QueryResult,_std::allocator<QueryResult>_> results;
  
  if (this->type == PRIMITIVE) {
    std::function<QueryResult_(PrimitiveQuery,_QueryCounters_*)>::operator()
              (__return_storage_ptr__,primitive,this->ngram,counters);
  }
  else {
    prefetch(this,0,3,false,prefetcher);
    QVar2 = this->type;
    if (QVar2 == MIN_OF) {
      results.super__Vector_base<QueryResult,_std::allocator<QueryResult>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      results.super__Vector_base<QueryResult,_std::allocator<QueryResult>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      results.super__Vector_base<QueryResult,_std::allocator<QueryResult>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      results_ptrs.super__Vector_base<QueryResult_*,_std::allocator<QueryResult_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      results_ptrs.super__Vector_base<QueryResult_*,_std::allocator<QueryResult_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      results_ptrs.super__Vector_base<QueryResult_*,_std::allocator<QueryResult_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<QueryResult,_std::allocator<QueryResult>_>::reserve
                (&results,((long)(this->queries).super__Vector_base<Query,_std::allocator<Query>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->queries).super__Vector_base<Query,_std::allocator<Query>_>.
                                _M_impl.super__Vector_impl_data._M_start) / 0x48);
      std::vector<QueryResult_*,_std::allocator<QueryResult_*>_>::reserve
                (&results_ptrs,
                 ((long)(this->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(this->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
                       super__Vector_impl_data._M_start) / 0x48);
      cutoff = this->count;
      pQVar4 = (this->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
               super__Vector_impl_data._M_finish;
      this_02 = (this->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_c8 = ((long)pQVar4 - (long)this_02) / 0x48;
      do {
        if (this_02 == pQVar4) {
          QueryResult::do_min_of(__return_storage_ptr__,cutoff,&results_ptrs,&counters->minofs_);
          break;
        }
        run(&next,this_02,primitive,prefetcher,counters);
        if (next.has_everything == true) {
          uVar1 = cutoff - 1;
          bVar6 = true;
          bVar5 = (int)cutoff < 2;
          cutoff = uVar1;
          if (bVar5) {
            (__return_storage_ptr__->results).run_.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            (__return_storage_ptr__->results).run_.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            (__return_storage_ptr__->results).sequence_.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            (__return_storage_ptr__->results).run_.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            (__return_storage_ptr__->results).sequence_.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            (__return_storage_ptr__->results).sequence_.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            __return_storage_ptr__->has_everything = true;
            bVar6 = false;
          }
        }
        else if ((next.results.sequence_.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start ==
                  next.results.sequence_.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish) &&
                (next.results.run_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                 ._M_impl.super__Vector_impl_data._M_start ==
                 next.results.run_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                 ._M_impl.super__Vector_impl_data._M_finish)) {
          bVar6 = (int)cutoff < (int)local_c8;
          if (!bVar6) {
            QueryResult::empty();
          }
          local_c8 = (ulong)((int)local_c8 - 1);
        }
        else {
          std::vector<QueryResult,_std::allocator<QueryResult>_>::emplace_back<QueryResult>
                    (&results,&next);
          local_88 = results.super__Vector_base<QueryResult,_std::allocator<QueryResult>_>._M_impl.
                     super__Vector_impl_data._M_finish + -1;
          std::vector<QueryResult*,std::allocator<QueryResult*>>::emplace_back<QueryResult*>
                    ((vector<QueryResult*,std::allocator<QueryResult*>> *)&results_ptrs,&local_88);
          bVar6 = true;
        }
        SortedRun::~SortedRun(&next.results);
        this_02 = this_02 + 1;
      } while (bVar6);
      std::_Vector_base<QueryResult_*,_std::allocator<QueryResult_*>_>::~_Vector_base
                (&results_ptrs.super__Vector_base<QueryResult_*,_std::allocator<QueryResult_*>_>);
      std::vector<QueryResult,_std::allocator<QueryResult>_>::~vector(&results);
    }
    else if (QVar2 == OR) {
      QueryResult::empty();
      this_01 = (this->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
                super__Vector_impl_data._M_start;
      pQVar3 = (this->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
               super__Vector_impl_data._M_finish;
      do {
        if (this_01 == pQVar3) {
          return __return_storage_ptr__;
        }
        run(&next,this_01,primitive,prefetcher,counters);
        QueryResult::do_or(__return_storage_ptr__,&next,&counters->ors_);
        SortedRun::~SortedRun(&next.results);
        this_01 = this_01 + 1;
      } while (__return_storage_ptr__->has_everything == false);
    }
    else {
      if (QVar2 != AND) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"Unexpected query type");
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      (__return_storage_ptr__->results).run_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->results).run_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__return_storage_ptr__->results).sequence_.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__return_storage_ptr__->results).run_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->results).sequence_.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->results).sequence_.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      __return_storage_ptr__->has_everything = true;
      lVar8 = 0;
      uVar7 = 0;
      do {
        if ((ulong)(((long)(this->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                    (long)(this->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
                          super__Vector_impl_data._M_start) / 0x48) <= uVar7) {
          return __return_storage_ptr__;
        }
        prefetch(this,(int)uVar7 + 1,3,true,prefetcher);
        run(&next,(Query *)((long)&((this->queries).
                                    super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
                                    super__Vector_impl_data._M_start)->type + lVar8),primitive,
            prefetcher,counters);
        QueryResult::do_and(__return_storage_ptr__,&next,&counters->ands_);
        SortedRun::~SortedRun(&next.results);
        bVar6 = QueryResult::is_empty(__return_storage_ptr__);
        lVar8 = lVar8 + 0x48;
        uVar7 = uVar7 + 1;
      } while (!bVar6);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QueryResult Query::run(const QueryPrimitive &primitive,
                       const PrefetchFunc &prefetcher,
                       QueryCounters *counters) const {
    // Case: primitive query - reduces to AND with tokens from query plan.
    if (type == QueryType::PRIMITIVE) {
        return primitive(ngram, counters);
    }

    constexpr int PRETECTH_RANGE = 3;
    prefetch(0, PRETECTH_RANGE, false, prefetcher);

    // Case: and. Short circuits when result is already empty.
    if (type == QueryType::AND) {
        auto result = QueryResult::everything();
        for (int i = 0; i < queries.size(); i++) {
            prefetch(i + 1, PRETECTH_RANGE, true, prefetcher);
            const auto &query = queries[i];
            result.do_and(query.run(primitive, prefetcher, counters),
                          &counters->ands());
            if (result.is_empty()) {
                break;
            }
        }
        return result;
    }
    // Case: or. Short circuits when result is already everything.
    if (type == QueryType::OR) {
        auto result = QueryResult::empty();
        for (auto &query : queries) {
            result.do_or(query.run(primitive, prefetcher, counters),
                         &counters->ors());
            if (result.is_everything()) {
                break;
            }
        }
        return result;
    }
    // Case: minof. We remove `everything` and `empty` sets from inputs, and
    // adjust cutoff or input size appropriately. Short circuits in two cases:
    // - cutoff is <= 0 (for example: 0 of ("a", "b")).
    // - cutoff is > size(inputs) (for example: 3 of ("a", "b"))
    // There is some logic duplication here and in QueryResult::do_min_of_real.
    if (type == QueryType::MIN_OF) {
        std::vector<QueryResult> results;
        std::vector<QueryResult *> results_ptrs;
        results.reserve(queries.size());
        results_ptrs.reserve(queries.size());
        int cutoff = count;
        int nonempty_sources = queries.size();
        for (const auto &query : queries) {
            QueryResult next = query.run(primitive, prefetcher, counters);
            if (next.is_everything()) {
                cutoff -= 1;
                if (cutoff <= 0) {
                    return QueryResult::everything();
                }
            } else if (next.is_empty()) {
                nonempty_sources -= 1;
                if (cutoff > nonempty_sources) {
                    return QueryResult::empty();
                }
            } else {
                results.emplace_back(std::move(next));
                results_ptrs.emplace_back(&results.back());
            }
        }
        return QueryResult::do_min_of(cutoff, results_ptrs,
                                      &counters->minofs());
    }
    throw std::runtime_error("Unexpected query type");
}